

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_test.cc
# Opt level: O2

void __thiscall fizplex::VerificationTest_Blend_Test::TestBody(VerificationTest_Blend_Test *this)

{
  double *pdVar1;
  char *in_R9;
  double dVar2;
  double dVar3;
  double dVar4;
  AssertHelper AStack_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  AssertionResult gtest_ar_;
  string local_158;
  string local_138;
  Simplex spx;
  LP lp;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"./test/blend.mps",(allocator<char> *)&spx);
  MPSReader::read_lp(&lp,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  Simplex::Simplex(&spx,&lp,0);
  Simplex::solve(&spx);
  pdVar1 = Simplex::get_z(&spx);
  dVar2 = ABS(-30.812149846 - *pdVar1);
  if (dVar2 <= 1e-07) {
    gtest_ar_.success_ = true;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    dVar3 = ABS(*pdVar1);
    dVar4 = 30.812149846;
    if (30.812149846 <= dVar3) {
      dVar4 = dVar3;
    }
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = dVar2 <= dVar4 * 1e-06;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)&gtest_ar_,
                 (AssertionResult *)"is_eq_norm(-3.0812149846E+01, spx.get_z())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/verification_test.cc"
                 ,0x1c,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_178,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&AStack_178);
      std::__cxx11::string::~string((string *)&local_158);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_170);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  Simplex::~Simplex(&spx);
  LP::~LP(&lp);
  return;
}

Assistant:

TEST(VerificationTest, Blend) {
  LP lp = MPSReader::read_lp("./test/blend.mps");

  Simplex spx(lp);
  spx.solve();
  EXPECT_TRUE(is_eq_norm(-3.0812149846E+01, spx.get_z()));
}